

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

void zng_gzclearerr(gzFile file)

{
  long in_RDI;
  char *unaff_retaddr;
  gz_state *state;
  
  if ((in_RDI != 0) && ((*(int *)(in_RDI + 0x18) == 0x1c4f || (*(int *)(in_RDI + 0x18) == 0x79b1))))
  {
    if (*(int *)(in_RDI + 0x18) == 0x1c4f) {
      *(undefined4 *)(in_RDI + 0x50) = 0;
      *(undefined4 *)(in_RDI + 0x54) = 0;
    }
    gz_error((gz_state *)file,state._4_4_,unaff_retaddr);
  }
  return;
}

Assistant:

void Z_EXPORT PREFIX(gzclearerr)(gzFile file) {
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return;

    /* clear error and end-of-file */
    if (state->mode == GZ_READ) {
        state->eof = 0;
        state->past = 0;
    }
    gz_error(state, Z_OK, NULL);
}